

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O2

ssize_t __thiscall
CompositedBupOutputter::write(CompositedBupOutputter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source_01;
  path *this_00;
  path local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  path local_88;
  path local_60;
  path local_38;
  
  if ((this->withMouthName)._M_string_length == 0) {
    if ((this->withFaceName)._M_string_length == 0) {
      std::operator+(&local_a8,&this->baseName,".png");
      std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
                (&local_d0,(__cxx11 *)&local_a8,__source_01);
      std::filesystem::__cxx11::operator/(&local_88,&this->basePath,&local_d0);
      (*(this->super_BupOutputter)._vptr_BupOutputter[6])(this,&this->base,&local_88);
      this_00 = &local_88;
    }
    else {
      std::operator+(&local_a8,&this->withFaceName,".png");
      std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
                (&local_d0,(__cxx11 *)&local_a8,__source_00);
      std::filesystem::__cxx11::operator/(&local_60,&this->basePath,&local_d0);
      (*(this->super_BupOutputter)._vptr_BupOutputter[6])(this,&this->withFace,&local_60);
      this_00 = &local_60;
    }
  }
  else {
    std::operator+(&local_a8,&this->withMouthName,".png");
    std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
              (&local_d0,(__cxx11 *)&local_a8,__source);
    std::filesystem::__cxx11::operator/(&local_38,&this->basePath,&local_d0);
    (*(this->super_BupOutputter)._vptr_BupOutputter[6])(this,&this->withMouth,&local_38);
    this_00 = &local_38;
  }
  std::filesystem::__cxx11::path::~path(this_00);
  std::filesystem::__cxx11::path::~path(&local_d0);
  sVar1 = std::__cxx11::string::~string((string *)&local_a8);
  return sVar1;
}

Assistant:

void write() override {
		if (!withMouthName.empty()) {
			write(withMouth, basePath/fs::u8path(withMouthName + ".png"));
		}
		else if (!withFaceName.empty()) {
			write(withFace, basePath/fs::u8path(withFaceName + ".png"));
		}
		else {
			write(base, basePath/fs::u8path(baseName + ".png"));
		}
	}